

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# line_monte_carlo.cpp
# Opt level: O1

double * monomial_value_1d(int n,int e,double *x)

{
  double *pdVar1;
  ulong uVar2;
  double dVar3;
  
  uVar2 = 0xffffffffffffffff;
  if (-1 < n) {
    uVar2 = (long)n * 8;
  }
  pdVar1 = (double *)operator_new__(uVar2);
  if (0 < n) {
    uVar2 = 0;
    do {
      dVar3 = pow(x[uVar2],(double)e);
      pdVar1[uVar2] = dVar3;
      uVar2 = uVar2 + 1;
    } while ((uint)n != uVar2);
  }
  return pdVar1;
}

Assistant:

double *monomial_value_1d ( int n, int e, double x[] )

//****************************************************************************80
//
//  Purpose:
//
//    MONOMIAL_VALUE_1D evaluates a monomial in 1D.
//
//  Discussion:
//
//    This routine evaluates a monomial of the form
//
//      product ( 1 <= i <= m ) x(i)^expon(i)
//
//    where the exponents are nonnegative integers.  Note that
//    if the combination 0^0 is encountered, it should be treated
//    as 1.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license. 
//
//  Modified:
//
//    17 January 2014
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, int N, the number of points at which the
//    monomial is to be evaluated.
//
//    Input, int E, the exponents.
//
//    Input, double X[N], the point coordinates.
//
//    Output, double MONOMIAL_VALUE_1D[N], the value of the monomial.
//
{
  int j;
  double *v;

  v = new double[n];

  for ( j = 0; j < n; j++ )
  {
    v[j] = pow ( x[j], e );
  }

  return v;
}